

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

void __thiscall flow::RetInstr::RetInstr(RetInstr *this,Value *result)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_31;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_30;
  Value *local_18;
  
  __l._M_len = 1;
  __l._M_array = &local_18;
  local_18 = result;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_30,__l,&local_31);
  TerminateInstr::TerminateInstr(&this->super_TerminateInstr,&local_30);
  if (local_30.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value =
       (_func_int **)&PTR__Instr_0019d1b0;
  return;
}

Assistant:

RetInstr::RetInstr(Value* result) : TerminateInstr({result}) {}